

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Gia_Man_t * Lf_ManPerformMapping(Gia_Man_t *p,Jf_Par_t *pPars)

{
  Tim_Man_t *p_00;
  int iVar1;
  Tim_Man_t *pTVar2;
  Gia_Man_t *p_01;
  Gia_Man_t *p_02;
  Tim_Man_t *pTimOld;
  Gia_Man_t *pNew;
  Jf_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  if (((p->pManTime == (void *)0x0) || (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 == 0)
      ) || (iVar1 = Gia_ManIsNormalized(p), iVar1 == 0)) {
    pTimOld = (Tim_Man_t *)Lf_ManPerformMappingInt(p,pPars);
    Gia_ManTransferTiming((Gia_Man_t *)pTimOld,p);
  }
  else {
    p_00 = (Tim_Man_t *)p->pManTime;
    pTVar2 = Tim_ManDup(p_00,1);
    p->pManTime = pTVar2;
    p_01 = Gia_ManDupUnnormalize(p);
    if (p_01 == (Gia_Man_t *)0x0) {
      return (Gia_Man_t *)0x0;
    }
    Gia_ManTransferTiming(p_01,p);
    p_02 = Lf_ManPerformMappingInt(p_01,pPars);
    if (p_02 != p_01) {
      Gia_ManTransferTiming(p_02,p_01);
      Gia_ManStop(p_01);
    }
    pTimOld = (Tim_Man_t *)Gia_ManDupNormalize(p_02,0);
    Gia_ManTransferMapping((Gia_Man_t *)pTimOld,p_02);
    Gia_ManTransferTiming((Gia_Man_t *)pTimOld,p_02);
    Gia_ManStop(p_02);
    Tim_ManStop((Tim_Man_t *)((Gia_Man_t *)pTimOld)->pManTime);
    ((Gia_Man_t *)pTimOld)->pManTime = p_00;
    iVar1 = Gia_ManIsNormalized((Gia_Man_t *)pTimOld);
    if (iVar1 == 0) {
      __assert_fail("Gia_ManIsNormalized(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                    ,0x8de,"Gia_Man_t *Lf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
    }
  }
  return (Gia_Man_t *)pTimOld;
}

Assistant:

Gia_Man_t * Lf_ManPerformMapping( Gia_Man_t * p, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew;
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) && Gia_ManIsNormalized(p) )
    {
        Tim_Man_t * pTimOld = (Tim_Man_t *)p->pManTime;
        p->pManTime = Tim_ManDup( pTimOld, 1 );
        pNew = Gia_ManDupUnnormalize( p );
        if ( pNew == NULL )
            return NULL;
        Gia_ManTransferTiming( pNew, p );
        p = pNew;
        // mapping
        pNew = Lf_ManPerformMappingInt( p, pPars );
        if ( pNew != p )
        {
            Gia_ManTransferTiming( pNew, p );
            Gia_ManStop( p );
        }
        // normalize
        pNew = Gia_ManDupNormalize( p = pNew, 0 );
        Gia_ManTransferMapping( pNew, p );
//        Gia_ManTransferPacking( pNew, p );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p ); // do not delete if the original one!
        // cleanup
        Tim_ManStop( (Tim_Man_t *)pNew->pManTime );
        pNew->pManTime = pTimOld;
        assert( Gia_ManIsNormalized(pNew) );
    }
    else 
    {
        // mapping
        pNew = Lf_ManPerformMappingInt( p, pPars );
        Gia_ManTransferTiming( pNew, p );
    }
    return pNew;
}